

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O0

shared_ptr<gui::MultilineTextBox>
gui::MultilineTextBox::create(shared_ptr<gui::MultilineTextBoxStyle> *style,String *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<gui::MultilineTextBox> sVar1;
  String *in_stack_00000180;
  shared_ptr<gui::MultilineTextBoxStyle> *in_stack_00000188;
  MultilineTextBox *in_stack_00000190;
  element_type *this;
  
  this = in_RDI;
  operator_new(0x3e0);
  std::shared_ptr<gui::MultilineTextBoxStyle>::shared_ptr
            ((shared_ptr<gui::MultilineTextBoxStyle> *)this,
             (shared_ptr<gui::MultilineTextBoxStyle> *)in_RDI);
  MultilineTextBox(in_stack_00000190,in_stack_00000188,in_stack_00000180);
  std::shared_ptr<gui::MultilineTextBox>::shared_ptr<gui::MultilineTextBox,void>
            ((shared_ptr<gui::MultilineTextBox> *)this,in_RDI);
  std::shared_ptr<gui::MultilineTextBoxStyle>::~shared_ptr
            ((shared_ptr<gui::MultilineTextBoxStyle> *)0x19fd76);
  sVar1.super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::MultilineTextBox>)
         sVar1.super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MultilineTextBox> MultilineTextBox::create(std::shared_ptr<MultilineTextBoxStyle> style, const sf::String& name) {
    return std::shared_ptr<MultilineTextBox>(new MultilineTextBox(style, name));
}